

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,BreakStatement *break_stmt,void *data)

{
  SyntaxTree *pSVar1;
  undefined8 uVar2;
  long in_RSI;
  SemanticAnalysisVisitor *in_RDI;
  TokenDetail *in_stack_00000040;
  char *in_stack_00000048;
  SemanticException *in_stack_00000050;
  
  pSVar1 = GetLoopAST(in_RDI);
  *(SyntaxTree **)(in_RSI + 0x28) = pSVar1;
  if (*(long *)(in_RSI + 0x28) == 0) {
    uVar2 = __cxa_allocate_exception(0x20);
    SemanticException::SemanticException(in_stack_00000050,in_stack_00000048,in_stack_00000040);
    __cxa_throw(uVar2,&SemanticException::typeinfo,SemanticException::~SemanticException);
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(BreakStatement *break_stmt, void *data)
    {
        break_stmt->loop_ = GetLoopAST();
        if (!break_stmt->loop_)
            throw SemanticException("not in any loop", break_stmt->break_);
    }